

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O2

void t42_parse_encoding(T42_Face face,T42_Loader loader)

{
  PS_TableRec *pPVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  undefined8 *puVar5;
  _func_void_PS_Table *p_Var6;
  byte *pbVar7;
  int iVar8;
  FT_Error FVar9;
  FT_UShort *pFVar10;
  FT_String **ppFVar11;
  FT_Long FVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  byte *pbVar16;
  FT_Long local_48;
  int local_3c;
  int iStack_38;
  FT_Error error;
  
  pbVar4 = (loader->parser).root.limit;
  puVar5 = (undefined8 *)face->psaux;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pbVar16 = (loader->parser).root.cursor;
  if (pbVar16 < pbVar4) {
    bVar2 = *pbVar16;
    if (bVar2 != 0x5b && 9 < bVar2 - 0x30) {
      if ((pbVar16 + 0x11 < pbVar4) &&
         (iVar8 = strncmp((char *)pbVar16,"StandardEncoding",0x10), iVar8 == 0)) {
        (face->type1).encoding_type = T1_ENCODING_TYPE_STANDARD;
        return;
      }
      if ((pbVar16 + 0xf < pbVar4) &&
         (iVar8 = strncmp((char *)pbVar16,"ExpertEncoding",0xe), iVar8 == 0)) {
        (face->type1).encoding_type = T1_ENCODING_TYPE_EXPERT;
        return;
      }
      if ((pbVar16 + 0x12 < pbVar4) &&
         (iVar8 = strncmp((char *)pbVar16,"ISOLatin1Encoding",0x11), iVar8 == 0)) {
        (face->type1).encoding_type = T1_ENCODING_TYPE_ISOLATIN1;
        return;
      }
      (loader->parser).root.error = 0xa2;
      return;
    }
    _iStack_38 = (loader->parser).root.memory;
    if (bVar2 == 0x5b) {
      (loader->parser).root.cursor = pbVar16 + 1;
      local_48 = 0x100;
    }
    else {
      local_48 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
      if (0x100 < (int)local_48) goto LAB_0022fb56;
    }
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    if ((loader->parser).root.cursor < pbVar4) {
      pPVar1 = &loader->encoding_table;
      pFVar10 = (face->type1).encoding.char_index;
      if (pFVar10 != (FT_UShort *)0x0) {
        ft_mem_free(_iStack_38,pFVar10);
        (face->type1).encoding.char_index = (FT_UShort *)0x0;
        ft_mem_free(_iStack_38,(face->type1).encoding.char_name);
        (face->type1).encoding.char_name = (FT_String **)0x0;
        p_Var6 = (loader->encoding_table).funcs.release;
        if (p_Var6 != (_func_void_PS_Table *)0x0) {
          (*p_Var6)(pPVar1);
        }
      }
      iVar8 = (int)local_48;
      (face->type1).encoding.num_chars = iVar8;
      loader->num_chars = iVar8;
      pFVar10 = (FT_UShort *)ft_mem_realloc(_iStack_38,2,0,(long)iVar8,(void *)0x0,&local_3c);
      (face->type1).encoding.char_index = pFVar10;
      if (local_3c == 0) {
        ppFVar11 = (FT_String **)ft_mem_realloc(_iStack_38,8,0,(long)iVar8,(void *)0x0,&local_3c);
        (face->type1).encoding.char_name = ppFVar11;
        if ((local_3c == 0) &&
           (local_3c = (**(code **)*puVar5)(pPVar1,local_48,_iStack_38), local_3c == 0)) {
          iVar15 = 0;
          iVar13 = 0;
          if (0 < iVar8) {
            iVar13 = iVar8;
          }
          local_3c = 0;
          iStack_38 = iVar13;
          for (; iStack_38 != iVar15; iVar15 = iVar15 + 1) {
            (*(loader->encoding_table).funcs.add)(pPVar1,iVar15,".notdef",8);
          }
          (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
          _iStack_38 = (FT_Memory)((ulong)(uint)error << 0x20);
          do {
            pbVar7 = (loader->parser).root.cursor;
            if (pbVar4 <= pbVar7) {
LAB_0022fe14:
              (face->type1).encoding_type = T1_ENCODING_TYPE_ARRAY;
              (loader->parser).root.cursor = pbVar16;
              return;
            }
            bVar3 = *pbVar7;
            if (bVar3 == 100) {
              pbVar16 = pbVar7 + 3;
              if ((((pbVar16 < pbVar4) && (pbVar7[1] == 0x65)) && (pbVar7[2] == 0x66)) &&
                 (((ulong)*pbVar16 < 0x21 && ((0x100003601U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0)))
                 ) goto LAB_0022fe14;
            }
            else if (bVar3 == 0x5d) {
              pbVar16 = pbVar7 + 1;
              goto LAB_0022fe14;
            }
            pbVar16 = pbVar7;
            if (bVar2 == 0x5b || bVar3 - 0x30 < 10) {
              if (bVar2 == 0x5b) {
                iVar13 = (int)_iStack_38;
              }
              else {
                FVar12 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
                iVar13 = (int)FVar12;
                (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
                pbVar16 = (loader->parser).root.cursor;
                if (pbVar7 == pbVar16) goto LAB_0022fe02;
              }
              if (((pbVar16 + 2 < pbVar4) && (*pbVar16 == 0x2f)) && (iStack_38 < iVar8)) {
                pbVar16 = pbVar16 + 1;
                (loader->parser).root.cursor = pbVar16;
                (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
                pbVar7 = (loader->parser).root.cursor;
                if (pbVar4 <= pbVar7) {
                  return;
                }
                if ((loader->parser).root.error != 0) {
                  return;
                }
                uVar14 = (long)pbVar7 - (long)pbVar16;
                FVar9 = (*(loader->encoding_table).funcs.add)(pPVar1,iVar13,pbVar16,(int)uVar14 + 1)
                ;
                (loader->parser).root.error = FVar9;
                if (FVar9 != 0) {
                  return;
                }
                (loader->encoding_table).elements[iVar13][uVar14 & 0xffffffff] = '\0';
                _iStack_38 = (FT_Memory)CONCAT44(error,iStack_38 + 1);
              }
              else if (bVar2 == 0x5b) {
LAB_0022fe02:
                (loader->parser).root.error = 2;
                return;
              }
            }
            else {
              (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
              if ((loader->parser).root.error != 0) {
                return;
              }
            }
            (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
          } while( true );
        }
      }
      (loader->parser).root.error = local_3c;
    }
  }
  else {
LAB_0022fb56:
    (loader->parser).root.error = 3;
  }
  return;
}

Assistant:

static void
  t42_parse_encoding( T42_Face    face,
                      T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;

    PSAux_Service  psaux  = (PSAux_Service)face->psaux;


    T1_Skip_Spaces( parser );
    cur = parser->root.cursor;
    if ( cur >= limit )
    {
      FT_ERROR(( "t42_parse_encoding: out of bounds\n" ));
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* if we have a number or `[', the encoding is an array, */
    /* and we must load it now                               */
    if ( ft_isdigit( *cur ) || *cur == '[' )
    {
      T1_Encoding  encode          = &face->type1.encoding;
      FT_Int       count, n;
      PS_Table     char_table      = &loader->encoding_table;
      FT_Memory    memory          = parser->root.memory;
      FT_Error     error;
      FT_Bool      only_immediates = 0;


      /* read the number of entries in the encoding; should be 256 */
      if ( *cur == '[' )
      {
        count           = 256;
        only_immediates = 1;
        parser->root.cursor++;
      }
      else
        count = (FT_Int)T1_ToInt( parser );

      /* only composite fonts (which we don't support) */
      /* can have larger values                        */
      if ( count > 256 )
      {
        FT_ERROR(( "t42_parse_encoding: invalid encoding array size\n" ));
        parser->root.error = FT_THROW( Invalid_File_Format );
        return;
      }

      T1_Skip_Spaces( parser );
      if ( parser->root.cursor >= limit )
        return;

      /* PostScript happily allows overwriting of encoding arrays */
      if ( encode->char_index )
      {
        FT_FREE( encode->char_index );
        FT_FREE( encode->char_name );
        T1_Release_Table( char_table );
      }

      /* we use a T1_Table to store our charnames */
      loader->num_chars = encode->num_chars = count;
      if ( FT_NEW_ARRAY( encode->char_index, count )     ||
           FT_NEW_ARRAY( encode->char_name,  count )     ||
           FT_SET_ERROR( psaux->ps_table_funcs->init(
                           char_table, count, memory ) ) )
      {
        parser->root.error = error;
        return;
      }

      /* We need to `zero' out encoding_table.elements */
      for ( n = 0; n < count; n++ )
      {
        char*  notdef = (char *)".notdef";


        (void)T1_Add_Table( char_table, n, notdef, 8 );
      }

      /* Now we need to read records of the form                */
      /*                                                        */
      /*   ... charcode /charname ...                           */
      /*                                                        */
      /* for each entry in our table.                           */
      /*                                                        */
      /* We simply look for a number followed by an immediate   */
      /* name.  Note that this ignores correctly the sequence   */
      /* that is often seen in type42 fonts:                    */
      /*                                                        */
      /*   0 1 255 { 1 index exch /.notdef put } for dup        */
      /*                                                        */
      /* used to clean the encoding array before anything else. */
      /*                                                        */
      /* Alternatively, if the array is directly given as       */
      /*                                                        */
      /*   /Encoding [ ... ]                                    */
      /*                                                        */
      /* we only read immediates.                               */

      n = 0;
      T1_Skip_Spaces( parser );

      while ( parser->root.cursor < limit )
      {
        cur = parser->root.cursor;

        /* we stop when we encounter `def' or `]' */
        if ( *cur == 'd' && cur + 3 < limit )
        {
          if ( cur[1] == 'e'          &&
               cur[2] == 'f'          &&
               t42_is_space( cur[3] ) )
          {
            FT_TRACE6(( "encoding end\n" ));
            cur += 3;
            break;
          }
        }
        if ( *cur == ']' )
        {
          FT_TRACE6(( "encoding end\n" ));
          cur++;
          break;
        }

        /* check whether we have found an entry */
        if ( ft_isdigit( *cur ) || only_immediates )
        {
          FT_Int  charcode;


          if ( only_immediates )
            charcode = n;
          else
          {
            charcode = (FT_Int)T1_ToInt( parser );
            T1_Skip_Spaces( parser );

            /* protect against invalid charcode */
            if ( cur == parser->root.cursor )
            {
              parser->root.error = FT_THROW( Unknown_File_Format );
              return;
            }
          }

          cur = parser->root.cursor;

          if ( cur + 2 < limit && *cur == '/' && n < count )
          {
            FT_UInt  len;


            cur++;

            parser->root.cursor = cur;
            T1_Skip_PS_Token( parser );
            if ( parser->root.cursor >= limit )
              return;
            if ( parser->root.error )
              return;

            len = (FT_UInt)( parser->root.cursor - cur );

            parser->root.error = T1_Add_Table( char_table, charcode,
                                               cur, len + 1 );
            if ( parser->root.error )
              return;
            char_table->elements[charcode][len] = '\0';

            n++;
          }
          else if ( only_immediates )
          {
            /* Since the current position is not updated for           */
            /* immediates-only mode we would get an infinite loop if   */
            /* we don't do anything here.                              */
            /*                                                         */
            /* This encoding array is not valid according to the       */
            /* type42 specification (it might be an encoding for a CID */
            /* type42 font, however), so we conclude that this font is */
            /* NOT a type42 font.                                      */
            parser->root.error = FT_THROW( Unknown_File_Format );
            return;
          }
        }
        else
        {
          T1_Skip_PS_Token( parser );
          if ( parser->root.error )
            return;
        }

        T1_Skip_Spaces( parser );
      }

      face->type1.encoding_type = T1_ENCODING_TYPE_ARRAY;
      parser->root.cursor       = cur;
    }

    /* Otherwise, we should have either `StandardEncoding', */
    /* `ExpertEncoding', or `ISOLatin1Encoding'             */
    else
    {
      if ( cur + 17 < limit                                            &&
           ft_strncmp( (const char*)cur, "StandardEncoding", 16 ) == 0 )
        face->type1.encoding_type = T1_ENCODING_TYPE_STANDARD;

      else if ( cur + 15 < limit                                          &&
                ft_strncmp( (const char*)cur, "ExpertEncoding", 14 ) == 0 )
        face->type1.encoding_type = T1_ENCODING_TYPE_EXPERT;

      else if ( cur + 18 < limit                                             &&
                ft_strncmp( (const char*)cur, "ISOLatin1Encoding", 17 ) == 0 )
        face->type1.encoding_type = T1_ENCODING_TYPE_ISOLATIN1;

      else
        parser->root.error = FT_ERR( Ignore );
    }
  }